

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

PaError PaAlsaStream_WaitForFrames(PaAlsaStream *self,unsigned_long *framesAvail,int *xrunOccurred)

{
  snd_pcm_t *psVar1;
  uint uVar2;
  uint uVar3;
  ulong *puVar4;
  uint uVar5;
  uint extraout_EAX;
  ulong uVar6;
  int *piVar7;
  int queryPlayback;
  int iVar8;
  pollfd *pfds;
  long lVar9;
  pollfd *pfds_00;
  ulong numFrames;
  char *pcVar10;
  uint uVar11;
  int xrun;
  int pollCapture;
  int pollPlayback;
  int pollTimeout;
  PaError local_70;
  int local_6c;
  uint local_68;
  uint local_64;
  ulong *local_60;
  int local_54;
  ulong local_50;
  int *local_48;
  PaAlsaStreamComponent *local_40;
  PaAlsaStreamComponent *local_38;
  
  local_64 = (uint)((self->playback).pcm != (snd_pcm_t *)0x0);
  local_68 = (uint)((self->capture).pcm != (snd_pcm_t *)0x0);
  local_54 = self->pollTimeout;
  local_6c = 0;
  local_60 = framesAvail;
  if (framesAvail == (unsigned_long *)0x0) {
    __assert_fail("framesAvail",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0xeb2,
                  "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)");
  }
  if (self->callbackMode == 0) {
    paUtilErr_ = PaAlsaStream_GetAvailableFrames(self,local_68,local_64,framesAvail,&local_6c);
    if (-1 < paUtilErr_) {
      iVar8 = local_6c;
      if (local_6c != 0) {
        local_70 = 0;
        goto LAB_00113123;
      }
      if (*local_60 != 0) {
        local_70 = 0;
        if ((self->capture).pcm != (snd_pcm_t *)0x0) {
          (self->capture).ready = 1;
        }
        if ((self->playback).pcm != (snd_pcm_t *)0x0) {
          (self->playback).ready = 1;
        }
        goto LAB_00113123;
      }
      goto LAB_00112c70;
    }
    pcVar10 = 
    "Expression \'PaAlsaStream_GetAvailableFrames( self, self->capture.pcm != NULL, self->playback.pcm != NULL, framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3768\n"
    ;
  }
  else {
LAB_00112c70:
    local_40 = &self->capture;
    local_70 = 0;
    local_48 = xrunOccurred;
    if (local_64 != 0 || local_68 != 0) {
      local_38 = &self->playback;
      local_70 = 0;
      local_50 = 0;
LAB_00112cbc:
      uVar3 = local_64;
      uVar2 = local_68;
      pthread_testcancel();
      if (uVar2 == 0) {
        uVar11 = 0;
        pfds = (pollfd *)0x0;
      }
      else {
        pfds = self->pfds;
        PaAlsaStreamComponent_BeginPolling(local_40,pfds);
        paUtilErr_ = 0;
        uVar11 = (self->capture).nfds;
      }
      if (uVar3 == 0) {
        pfds_00 = (pollfd *)0x0;
      }
      else {
        if (uVar2 == 0) {
          uVar6 = 0;
        }
        else {
          uVar6 = (ulong)(self->capture).nfds;
        }
        pfds_00 = self->pfds + uVar6;
        PaAlsaStreamComponent_BeginPolling(local_38,pfds_00);
        paUtilErr_ = 0;
        uVar11 = uVar11 + (self->playback).nfds;
      }
      if (self->callbackMode != 0) {
        pthread_setcancelstate(0,(int *)0x0);
      }
      uVar5 = poll((pollfd *)self->pfds,(long)(int)uVar11,local_54);
      uVar11 = uVar5;
      if (self->callbackMode != 0) {
        uVar11 = pthread_setcancelstate(1,(int *)0x0);
      }
      if ((int)uVar5 < 0) {
        piVar7 = __errno_location();
        if (*piVar7 == 4) {
          Pa_Sleep(1);
          lVar9 = 6;
          uVar11 = extraout_EAX;
          goto LAB_00112f09;
        }
        paUtilErr_ = -0x2702;
        pcVar10 = 
        "Expression \'paInternalError\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3836\n"
        ;
LAB_00112e60:
        PaUtil_DebugPrint(pcVar10);
        lVar9 = 4;
        local_70 = paUtilErr_;
        uVar11 = paUtilErr_;
      }
      else {
        if (uVar5 != 0) {
          if ((uVar2 == 0) ||
             (uVar11 = PaAlsaStreamComponent_EndPolling(local_40,pfds,(int *)&local_68,&local_6c),
             paUtilErr_ = uVar11, -1 < (int)uVar11)) {
            if ((uVar3 == 0) ||
               (uVar11 = PaAlsaStreamComponent_EndPolling
                                   (local_38,pfds_00,(int *)&local_64,&local_6c),
               paUtilErr_ = uVar11, -1 < (int)uVar11)) {
              local_50 = 0;
              lVar9 = 7;
              if (local_6c == 0) goto LAB_00112e80;
              goto LAB_00112f09;
            }
            local_50 = 0;
            pcVar10 = 
            "Expression \'PaAlsaStreamComponent_EndPolling( &self->playback, playbackPfds, &pollPlayback, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3875\n"
            ;
          }
          else {
            local_50 = 0;
            pcVar10 = 
            "Expression \'PaAlsaStreamComponent_EndPolling( &self->capture, capturePfds, &pollCapture, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3871\n"
            ;
          }
          goto LAB_00112e60;
        }
        iVar8 = (int)local_50;
        if (0 < iVar8) {
          Pa_Sleep(1);
        }
        uVar11 = iVar8 + 1;
        local_50 = (ulong)uVar11;
        if (iVar8 < 0x7ff) {
LAB_00112e80:
          lVar9 = 0;
          if (((self->capture).pcm != (snd_pcm_t *)0x0) &&
             ((self->playback).pcm != (snd_pcm_t *)0x0)) {
            if (local_64 == 0 && local_68 != 0) {
              lVar9 = 0;
              paUtilErr_ = ContinuePoll(self,StreamDirection_In,&local_54,(int *)&local_68);
              uVar11 = paUtilErr_;
              if (paUtilErr_ < 0) {
                pcVar10 = 
                "Expression \'ContinuePoll( self, StreamDirection_In, &pollTimeout, &pollCapture )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3891\n"
                ;
                goto LAB_00112e60;
              }
            }
            else {
              uVar11 = CONCAT31((int3)(local_68 >> 8),local_68 != 0 || local_64 == 0);
              if ((local_68 == 0 && local_64 != 0) &&
                 (paUtilErr_ = ContinuePoll(self,StreamDirection_Out,&local_54,(int *)&local_64),
                 lVar9 = 0, uVar11 = paUtilErr_, paUtilErr_ < 0)) {
                pcVar10 = 
                "Expression \'ContinuePoll( self, StreamDirection_Out, &pollTimeout, &pollPlayback )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3895\n"
                ;
                goto LAB_00112e60;
              }
            }
          }
        }
        else {
          *local_60 = 0;
          local_6c = 1;
          lVar9 = 5;
        }
      }
LAB_00112f09:
      if (7 < (uint)lVar9) {
switchD_00112f22_caseD_1:
        return uVar11;
      }
      uVar11 = (&switchD_00112f22::switchdataD_00116d00)[lVar9] + 0x116d00;
      switch(lVar9) {
      case 0:
      case 6:
        goto switchD_00112f22_caseD_0;
      default:
        goto switchD_00112f22_caseD_1;
      case 4:
      case 5:
        goto switchD_00112f22_caseD_4;
      case 7:
        break;
      }
    }
switchD_00112f22_caseD_7:
    xrunOccurred = local_48;
    if (local_6c != 0) {
switchD_00112f22_caseD_4:
      iVar8 = local_6c;
      xrunOccurred = local_48;
      goto LAB_00113123;
    }
    queryPlayback = 0;
    iVar8 = 0;
    if ((self->capture).pcm != (snd_pcm_t *)0x0) {
      iVar8 = (self->capture).ready;
    }
    if ((self->playback).pcm != (snd_pcm_t *)0x0) {
      queryPlayback = (self->playback).ready;
    }
    paUtilErr_ = PaAlsaStream_GetAvailableFrames(self,iVar8,queryPlayback,local_60,&local_6c);
    puVar4 = local_60;
    if (-1 < paUtilErr_) {
      psVar1 = (self->capture).pcm;
      iVar8 = local_6c;
      if (psVar1 != (snd_pcm_t *)0x0) {
        if ((self->playback).pcm != (snd_pcm_t *)0x0) {
          if (((self->playback).ready == 0) && (self->neverDropInput == 0)) {
            if ((self->capture).ready == 0) {
              __assert_fail("self->capture.ready",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                            ,0xf4c,
                            "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)"
                           );
            }
            uVar6 = (self->capture).framesPerPeriod;
            numFrames = *local_60;
            if (uVar6 < *local_60) {
              numFrames = uVar6;
            }
            PaAlsaStreamComponent_EndProcessing(local_40,numFrames,&local_6c);
            *puVar4 = 0;
            (self->capture).ready = 0;
            iVar8 = local_6c;
          }
          goto LAB_00113123;
        }
        if (psVar1 != (snd_pcm_t *)0x0) {
          if ((self->capture).ready == 0) {
            __assert_fail("self->capture.ready",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                          ,0xf54,
                          "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)"
                         );
          }
          goto LAB_00113123;
        }
      }
      if ((self->playback).ready == 0) {
        __assert_fail("self->playback.ready",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0xf56,
                      "PaError PaAlsaStream_WaitForFrames(PaAlsaStream *, unsigned long *, int *)");
      }
      goto LAB_00113123;
    }
    pcVar10 = 
    "Expression \'PaAlsaStream_GetAvailableFrames( self, captureReady, playbackReady, framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3909\n"
    ;
  }
  PaUtil_DebugPrint(pcVar10);
  local_70 = paUtilErr_;
  iVar8 = local_6c;
LAB_00113123:
  while( true ) {
    while (iVar8 == 0) {
      if (((*local_60 == 0) || ((self->capture).ready != 0)) || ((self->playback).ready != 0))
      goto LAB_0011318e;
      PaUtil_DebugPrint(
                       "Expression \'self->capture.ready || self->playback.ready\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3942\n"
                       );
      local_70 = -0x2702;
    }
    paUtilErr_ = PaAlsaStream_HandleXrun(self);
    if (-1 < paUtilErr_) break;
    PaUtil_DebugPrint(
                     "Expression \'PaAlsaStream_HandleXrun( self )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3934\n"
                     );
    local_70 = paUtilErr_;
  }
  *local_60 = 0;
LAB_0011318e:
  *xrunOccurred = iVar8;
  return local_70;
switchD_00112f22_caseD_0:
  if (local_68 == 0 && local_64 == 0) goto switchD_00112f22_caseD_7;
  goto LAB_00112cbc;
}

Assistant:

static PaError PaAlsaStream_WaitForFrames( PaAlsaStream *self, unsigned long *framesAvail, int *xrunOccurred )
{
    PaError result = paNoError;
    int pollPlayback = self->playback.pcm != NULL, pollCapture = self->capture.pcm != NULL;
    int pollTimeout = self->pollTimeout;
    int xrun = 0, timeouts = 0;
    int pollResults;

    assert( self );
    assert( framesAvail );

    if( !self->callbackMode )
    {
        /* In blocking mode we will only wait if necessary */
        PA_ENSURE( PaAlsaStream_GetAvailableFrames( self, self->capture.pcm != NULL, self->playback.pcm != NULL,
                    framesAvail, &xrun ) );
        if( xrun )
        {
            goto end;
        }

        if( *framesAvail > 0 )
        {
            /* Mark pcms ready from poll */
            if( self->capture.pcm )
                self->capture.ready = 1;
            if( self->playback.pcm )
                self->playback.ready = 1;

            goto end;
        }
    }

    while( pollPlayback || pollCapture )
    {
        int totalFds = 0;
        struct pollfd *capturePfds = NULL, *playbackPfds = NULL;

#ifdef PTHREAD_CANCELED
        pthread_testcancel();
#endif
        if( pollCapture )
        {
            capturePfds = self->pfds;
            PA_ENSURE( PaAlsaStreamComponent_BeginPolling( &self->capture, capturePfds ) );
            totalFds += self->capture.nfds;
        }
        if( pollPlayback )
        {
            /* self->pfds is in effect an array of fds; if necessary, index past the capture fds */
            playbackPfds = self->pfds + (pollCapture ? self->capture.nfds : 0);
            PA_ENSURE( PaAlsaStreamComponent_BeginPolling( &self->playback, playbackPfds ) );
            totalFds += self->playback.nfds;
        }

#ifdef PTHREAD_CANCELED
        if( self->callbackMode )
        {
            /* To allow 'Abort' to terminate the callback thread, enable cancelability just for poll() (& disable after) */
            pthread_setcancelstate( PTHREAD_CANCEL_ENABLE, NULL );
        }
#endif

        pollResults = poll( self->pfds, totalFds, pollTimeout );

#ifdef PTHREAD_CANCELED
        if( self->callbackMode )
        {
            pthread_setcancelstate( PTHREAD_CANCEL_DISABLE, NULL );
        }
#endif

        if( pollResults < 0 )
        {
            /*  XXX: Depend on preprocessor condition? */
            if( errno == EINTR )
            {
                /* gdb */
                Pa_Sleep( 1 ); /* avoid hot loop */
                continue;
            }

            /* TODO: Add macro for checking system calls */
            PA_ENSURE( paInternalError );
        }
        else if( pollResults == 0 )
        {
           /* Suspended, paused or failed device can provide 0 poll results. To avoid deadloop in such situation
            * we simply run counter 'timeouts' which detects 0 poll result and accumulates. As soon as 2048 timouts (around 2 seconds)
            * are achieved we simply fail function with paTimedOut to notify waiting methods that device is not capable
            * of providing audio data anymore and needs some corresponding recovery action.
            * Note that 'timeouts' is reset to 0 if poll() managed to return non 0 results.
            */

            /*PA_DEBUG(( "%s: poll == 0 results, timed out, %d times left\n", __FUNCTION__, 2048 - timeouts ));*/
            ++ timeouts;
            if( timeouts > 1 ) /* sometimes device times out, but normally once, so we do not sleep any time */
            {
                Pa_Sleep( 1 ); /* avoid hot loop */
            }
            /* not else ! */
            if( timeouts >= 2048 ) /* audio device not working, shall return error to notify waiters */
            {
                *framesAvail = 0; /* no frames available for processing */
                xrun = 1; /* try recovering device */

                PA_DEBUG(( "%s: poll timed out\n", __FUNCTION__, timeouts ));
                goto end;/*PA_ENSURE( paTimedOut );*/
            }
        }
        else if( pollResults > 0 )
        {
            /* reset timouts counter */
            timeouts = 0;

            /* check the return status of our pfds */
            if( pollCapture )
            {
                PA_ENSURE( PaAlsaStreamComponent_EndPolling( &self->capture, capturePfds, &pollCapture, &xrun ) );
            }
            if( pollPlayback )
            {
                PA_ENSURE( PaAlsaStreamComponent_EndPolling( &self->playback, playbackPfds, &pollPlayback, &xrun ) );
            }
            if( xrun )
            {
                break;
            }
        }

        /* @concern FullDuplex If only one of two pcms is ready we may want to compromise between the two.
         * If there is less than half a period's worth of samples left of frames in the other pcm's buffer we will
         * stop polling.
         */
        if( self->capture.pcm && self->playback.pcm )
        {
            if( pollCapture && !pollPlayback )
            {
                PA_ENSURE( ContinuePoll( self, StreamDirection_In, &pollTimeout, &pollCapture ) );
            }
            else if( pollPlayback && !pollCapture )
            {
                PA_ENSURE( ContinuePoll( self, StreamDirection_Out, &pollTimeout, &pollPlayback ) );
            }
        }
    }

    if( !xrun )
    {
        /* Get the number of available frames for the pcms that are marked ready.
         * @concern FullDuplex If only one direction is marked ready (from poll), the number of frames available for
         * the other direction is returned. Output is normally preferred over capture however, so capture frames may be
         * discarded to avoid overrun unless paNeverDropInput is specified.
         */
        int captureReady = self->capture.pcm ? self->capture.ready : 0,
            playbackReady = self->playback.pcm ? self->playback.ready : 0;
        PA_ENSURE( PaAlsaStream_GetAvailableFrames( self, captureReady, playbackReady, framesAvail, &xrun ) );

        if( self->capture.pcm && self->playback.pcm )
        {
            if( !self->playback.ready && !self->neverDropInput )
            {
                /* Drop input, a period's worth */
                assert( self->capture.ready );
                PaAlsaStreamComponent_EndProcessing( &self->capture, PA_MIN( self->capture.framesPerPeriod,
                            *framesAvail ), &xrun );
                *framesAvail = 0;
                self->capture.ready = 0;
            }
        }
        else if( self->capture.pcm )
            assert( self->capture.ready );
        else
            assert( self->playback.ready );
    }

end:
error:
    if( xrun )
    {
        /* Recover from the xrun state */
        PA_ENSURE( PaAlsaStream_HandleXrun( self ) );
        *framesAvail = 0;
    }
    else
    {
        if( 0 != *framesAvail )
        {
            /* If we're reporting frames eligible for processing, one of the handles better be ready */
            PA_UNLESS( self->capture.ready || self->playback.ready, paInternalError );
        }
    }
    *xrunOccurred = xrun;

    return result;
}